

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.h
# Opt level: O2

void __thiscall
FunctionData::FunctionData
          (FunctionData *this,Allocator *allocator,SynBase *source,ScopeData *scope,bool coroutine,
          bool accessor,bool isOperator,TypeFunction *type,TypeBase *contextType,SynIdentifier *name
          ,IntrusiveList<MatchData> generics,uint uniqueId)

{
  uint uVar1;
  
  this->source = source;
  this->scope = scope;
  this->coroutine = coroutine;
  this->accessor = accessor;
  this->isOperator = isOperator;
  this->type = type;
  this->contextType = contextType;
  this->name = name;
  (this->generics).head = generics.head;
  (this->generics).tail = generics.tail;
  this->uniqueId = uniqueId;
  (this->aliases).head = (MatchData *)0x0;
  (this->aliases).tail = (MatchData *)0x0;
  SmallArray<ArgumentData,_4U>::SmallArray(&this->arguments,allocator);
  (this->instances).allocator = allocator;
  (this->instances).data = (this->instances).little;
  (this->instances).count = 0;
  (this->instances).max = 8;
  (this->argumentVariables).head = (VariableHandle *)0x0;
  (this->argumentVariables).tail = (VariableHandle *)0x0;
  (this->upvalues).head = (UpvalueData *)0x0;
  (this->upvalues).tail = (UpvalueData *)0x0;
  SmallDenseMap<VariableData_*,_UpvalueData_*,_VariableDataHasher,_2U>::SmallDenseMap
            (&this->upvalueVariableMap,allocator);
  SmallDenseSet<InplaceStr,_InplaceStrHasher,_2U>::SmallDenseSet(&this->upvalueNameSet,allocator);
  (this->coroutineState).head = (CoroutineStateData *)0x0;
  (this->coroutineState).tail = (CoroutineStateData *)0x0;
  SmallDenseMap<VariableData_*,_CoroutineStateData_*,_VariableDataHasher,_2U>::SmallDenseMap
            (&this->coroutineStateVariableMap,allocator);
  SmallDenseSet<InplaceStr,_InplaceStrHasher,_2U>::SmallDenseSet
            (&this->coroutineStateNameSet,allocator);
  (this->closeUpvalues).head = (CloseUpvaluesData *)0x0;
  (this->closeUpvalues).tail = (CloseUpvaluesData *)0x0;
  this->importModule = (ModuleData *)0x0;
  this->isInternal = false;
  this->isHidden = false;
  this->attributes = 0;
  uVar1 = InplaceStr::hash(&name->name);
  this->nameHash = uVar1;
  this->functionIndex = 0xffffffff;
  this->isPrototype = false;
  this->yieldCount = 0;
  this->hasExplicitReturn = false;
  this->vmFunction = (VmFunction *)0x0;
  this->nextTranslateRestoreBlock = 0;
  this->implementation = (FunctionData *)0x0;
  this->proto = (FunctionData *)0x0;
  this->isGenericInstance = false;
  this->definition = (SynFunctionDefinition *)0x0;
  this->delayedDefinition = (Lexeme *)0x0;
  this->declaration = (ExprBase *)0x0;
  this->functionScope = (ScopeData *)0x0;
  this->argumentsSize = 0;
  this->stackSize = 0;
  this->contextArgument = (VariableData *)0x0;
  this->coroutineJumpOffset = (VariableData *)0x0;
  return;
}

Assistant:

FunctionData(Allocator *allocator, SynBase *source, ScopeData *scope, bool coroutine, bool accessor, bool isOperator, TypeFunction *type, TypeBase *contextType, SynIdentifier *name, IntrusiveList<MatchData> generics, unsigned uniqueId): source(source), scope(scope), coroutine(coroutine), accessor(accessor), isOperator(isOperator), type(type), contextType(contextType), name(name), generics(generics), uniqueId(uniqueId), arguments(allocator), instances(allocator), upvalueVariableMap(allocator), upvalueNameSet(allocator), coroutineStateVariableMap(allocator), coroutineStateNameSet(allocator)
	{
		importModule = 0;

		isInternal = false;

		isHidden = false;

		attributes = 0;

		nameHash = name->name.hash();

		functionIndex = ~0u;

		isPrototype = false;
		implementation = NULL;

		proto = NULL;
		isGenericInstance = false;

		definition = NULL;
		delayedDefinition = NULL;

		declaration = NULL;

		functionScope = NULL;
		argumentsSize = 0;
		stackSize = 0;

		contextArgument = NULL;

		coroutineJumpOffset = NULL;

		yieldCount = 0;

		hasExplicitReturn = false;

		vmFunction = NULL;

		nextTranslateRestoreBlock = 0;
	}